

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscrete.cpp
# Opt level: O1

void __thiscall
MultiAgentDecisionProcessDiscrete::CreateNewTransitionModel(MultiAgentDecisionProcessDiscrete *this)

{
  bool bVar1;
  code *pcVar2;
  int iVar3;
  int iVar4;
  TransitionModelMappingSparse *this_00;
  
  if ((this->_m_initialized == true) && (this->_m_p_tModel != (TransitionModelDiscrete *)0x0)) {
    (*(this->_m_p_tModel->super_TransitionModelDiscreteInterface).super_TransitionModel.
      _vptr_TransitionModel[1])();
  }
  bVar1 = this->_m_sparse;
  this_00 = (TransitionModelMappingSparse *)operator_new(0x28);
  pcVar2 = *(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x30);
  if (bVar1 == true) {
    iVar3 = (*pcVar2)(this);
    iVar4 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x70))(this);
    TransitionModelMappingSparse::TransitionModelMappingSparse(this_00,iVar3,iVar4);
  }
  else {
    iVar3 = (*pcVar2)(this);
    iVar4 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x70))(this);
    TransitionModelMapping::TransitionModelMapping((TransitionModelMapping *)this_00,iVar3,iVar4);
  }
  this->_m_p_tModel = (TransitionModelDiscrete *)this_00;
  return;
}

Assistant:

void MultiAgentDecisionProcessDiscrete::CreateNewTransitionModel()
{
    if(_m_initialized)
        delete(_m_p_tModel);

    if(_m_sparse)
        _m_p_tModel=new TransitionModelMappingSparse(GetNrStates(),
                                                     GetNrJointActions());
    else
        _m_p_tModel=new TransitionModelMapping(GetNrStates(),
                                               GetNrJointActions());

}